

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

Instr * __thiscall
LowererMDArch::LowerCallIDynamic
          (LowererMDArch *this,Instr *callInstr,Instr *saveThisArgOutInstr,Opnd *argsLength,
          ushort callFlags,Instr *insertBeforeInstrForCFG)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ushort uVar4;
  undefined4 *puVar5;
  IntConstOpnd *src2Opnd;
  Opnd *pOVar6;
  Instr *pIVar7;
  uint32 argCount;
  
  IR::Instr::InsertBefore(callInstr,saveThisArgOutInstr);
  LoadDynamicArgument(this,saveThisArgOutInstr,3);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  if (bVar2) {
    OVar3 = IR::Opnd::GetKind(argsLength);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) goto LAB_00643e41;
      *puVar5 = 0;
    }
    uVar4 = callInstr->m_func->actualCount;
    if (argsLength[1]._vptr_Opnd != (_func_int **)(ulong)uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x260,
                         "(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount)"
                         ,
                         "argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount"
                        );
      if (!bVar2) {
LAB_00643e41:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      uVar4 = callInstr->m_func->actualCount;
    }
    if (this->m_func->m_argSlotsForFunctionsCalled < uVar4 + 3) {
      this->m_func->m_argSlotsForFunctionsCalled = uVar4 + 3;
    }
  }
  else {
    src2Opnd = IR::IntConstOpnd::New(1,TyInt64,this->m_func,false);
    pIVar7 = IR::Instr::New(ADD,argsLength,argsLength,&src2Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(callInstr,pIVar7);
    if (this->m_func->m_argSlotsForFunctionsCalled < 0x12) {
      this->m_func->m_argSlotsForFunctionsCalled = 0x12;
    }
  }
  pOVar6 = GetArgSlotOpnd(this,2,(StackSym *)0x0,false);
  pIVar7 = IR::Instr::New(MOV,pOVar6,argsLength,this->m_func);
  IR::Instr::InsertBefore(callInstr,pIVar7);
  pOVar6 = IR::Instr::UnlinkSrc1(callInstr);
  GeneratePreCall(this,callInstr,pOVar6,insertBeforeInstrForCFG);
  bVar2 = Func::IsInlinee(callInstr->m_func);
  argCount = 4;
  if (bVar2) {
    argCount = callInstr->m_func->actualCount + 2;
  }
  LowerCall(this,callInstr,argCount);
  return callInstr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerCallIDynamic(IR::Instr *callInstr, IR::Instr*saveThisArgOutInstr, IR::Opnd *argsLength, ushort callFlags, IR::Instr * insertBeforeInstrForCFG)
{
    callInstr->InsertBefore(saveThisArgOutInstr); //Move this Argout next to call;
    this->LoadDynamicArgument(saveThisArgOutInstr, 3); //this pointer is the 3rd argument

    /*callInfo*/
    if (callInstr->m_func->IsInlinee())
    {
        Assert(argsLength->AsIntConstOpnd()->GetValue() == callInstr->m_func->actualCount);
        this->SetMaxArgSlots((Js::ArgSlot)callInstr->m_func->actualCount);
    }
    else
    {
        callInstr->InsertBefore(IR::Instr::New(Js::OpCode::ADD, argsLength, argsLength, IR::IntConstOpnd::New(1, TyMachReg, this->m_func), this->m_func));
        this->SetMaxArgSlots(Js::InlineeCallInfo::MaxInlineeArgoutCount);
    }
    callInstr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, this->GetArgSlotOpnd(2), argsLength, this->m_func));

    IR::Opnd    *funcObjOpnd = callInstr->UnlinkSrc1();
    GeneratePreCall(callInstr, funcObjOpnd, insertBeforeInstrForCFG);

    // Normally for dynamic calls we move 4 args to registers and push remaining
    // args onto stack (Windows convention, and unchanged on xplat). We need to
    // manully home 4 args. inlinees lower differently and follow platform ABI.
    // So we need to manually home actualArgsCount + 2 args (function, callInfo).
    const uint32 homeArgs = callInstr->m_func->IsInlinee() ?
                                callInstr->m_func->actualCount + 2 : 4;
    LowerCall(callInstr, homeArgs);

    return callInstr;
}